

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> __thiscall
groundupdbext::EmbeddedDatabase::createEmpty
          (EmbeddedDatabase *this,string *dbname,
          unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
          *kvStore,unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                   *idxStore)

{
  string local_48;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> *local_28;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
  *idxStore_local;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
  *kvStore_local;
  string *dbname_local;
  
  local_28 = idxStore;
  idxStore_local = kvStore;
  kvStore_local =
       (unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> *)
       dbname;
  dbname_local = (string *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)dbname);
  Impl::createEmpty((Impl *)this,&local_48,idxStore_local,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return (__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
            )this;
}

Assistant:

const std::unique_ptr<IDatabase> EmbeddedDatabase::createEmpty(std::string dbname,std::unique_ptr<KeyValueStore>& kvStore,std::unique_ptr<KeyValueStore>& idxStore) {
  return EmbeddedDatabase::Impl::createEmpty(dbname, kvStore, idxStore);
}